

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O2

void __thiscall Account::Account(Account *this)

{
  (this->_username)._M_dataplus._M_p = (pointer)&(this->_username).field_2;
  (this->_username)._M_string_length = 0;
  (this->_username).field_2._M_local_buf[0] = '\0';
  (this->m_characters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_characters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_characters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)this);
  this->_password = 0;
  this->_account_level = 2;
  return;
}

Assistant:

Account::Account() {
    _username = "";
    _password = 0;
    _account_level = NORMAL;
}